

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

int vs_start(bitstream *str,uint32_t *val)

{
  vs_dir vVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  void *pvVar5;
  bitstream *in_RSI;
  int *in_RDI;
  int bit;
  int nsbit;
  int nzbit;
  uint in_stack_ffffffffffffffd8;
  int size;
  
  if ((in_RDI[0xb] == 0) || (in_RDI[0xb] == 2)) {
    iVar4 = 0x10;
    if (in_RDI[0xb] == 0) {
      iVar4 = 0xf;
    }
    uVar2 = 5;
    if (in_RDI[0xb] == 0) {
      uVar2 = 4;
    }
    while( true ) {
      size = 0;
      if (iVar4 <= in_RDI[10]) {
        do {
          if (size != 0) {
            iVar4 = vs_u(in_RSI,(uint32_t *)CONCAT44(iVar4,uVar2),size);
            if (iVar4 != 0) {
              return 1;
            }
            return 0;
          }
          size = 1;
          iVar3 = vs_bit((bitstream *)CONCAT44(1,in_stack_ffffffffffffffd8),(uint32_t *)0x1021d5);
        } while (iVar3 == 0);
        return 1;
      }
      iVar3 = vs_bit((bitstream *)(ulong)in_stack_ffffffffffffffd8,(uint32_t *)0x102175);
      if (iVar3 != 0) break;
      if (size != 0) {
        fprintf(_stderr,"Found premature 1 bit when searching for a start code!\n");
        return 1;
      }
    }
    return 1;
  }
  if (in_RDI[7] != 7) {
    fprintf(_stderr,"Start code attempted at non-bytealigned position\n");
    return 1;
  }
  if (*in_RDI == 0) {
    if (in_RDI[5] <= in_RDI[4]) {
      if (in_RDI[5] == 0) {
        in_RDI[5] = 0x10;
      }
      else {
        in_RDI[5] = in_RDI[5] << 1;
      }
      pvVar5 = realloc(*(void **)(in_RDI + 2),(long)in_RDI[5]);
      *(void **)(in_RDI + 2) = pvVar5;
    }
    iVar4 = in_RDI[4];
    in_RDI[4] = iVar4 + 1;
    *(undefined1 *)(*(long *)(in_RDI + 2) + (long)iVar4) = 0;
    if (in_RDI[5] <= in_RDI[4]) {
      if (in_RDI[5] == 0) {
        in_RDI[5] = 0x10;
      }
      else {
        in_RDI[5] = in_RDI[5] << 1;
      }
      pvVar5 = realloc(*(void **)(in_RDI + 2),(long)in_RDI[5]);
      *(void **)(in_RDI + 2) = pvVar5;
    }
    iVar4 = in_RDI[4];
    in_RDI[4] = iVar4 + 1;
    *(undefined1 *)(*(long *)(in_RDI + 2) + (long)iVar4) = 0;
    if (in_RDI[5] <= in_RDI[4]) {
      if (in_RDI[5] == 0) {
        in_RDI[5] = 0x10;
      }
      else {
        in_RDI[5] = in_RDI[5] << 1;
      }
      pvVar5 = realloc(*(void **)(in_RDI + 2),(long)in_RDI[5]);
      *(void **)(in_RDI + 2) = pvVar5;
    }
    iVar4 = in_RDI[4];
    in_RDI[4] = iVar4 + 1;
    *(undefined1 *)(*(long *)(in_RDI + 2) + (long)iVar4) = 1;
    if (in_RDI[5] <= in_RDI[4]) {
      if (in_RDI[5] == 0) {
        in_RDI[5] = 0x10;
      }
      else {
        in_RDI[5] = in_RDI[5] << 1;
      }
      pvVar5 = realloc(*(void **)(in_RDI + 2),(long)in_RDI[5]);
      *(void **)(in_RDI + 2) = pvVar5;
    }
    vVar1 = in_RSI->dir;
    iVar4 = in_RDI[4];
    in_RDI[4] = iVar4 + 1;
    *(char *)(*(long *)(in_RDI + 2) + (long)iVar4) = (char)vVar1;
  }
  else {
    in_RDI[9] = in_RDI[9] + -1;
    do {
      in_RDI[9] = in_RDI[9] + 1;
      if (in_RDI[4] <= in_RDI[8]) {
        fprintf(_stderr,"End of bitstream when searching for a start code!\n");
        return 1;
      }
      iVar4 = in_RDI[8];
      in_RDI[8] = iVar4 + 1;
      *(undefined1 *)(in_RDI + 6) = *(undefined1 *)(*(long *)(in_RDI + 2) + (long)iVar4);
    } while ((char)in_RDI[6] == '\0');
    if ((char)in_RDI[6] != '\x01') {
      fprintf(_stderr,"Found byte %08x when searching for a start code!\n",
              (ulong)*(byte *)(in_RDI + 6));
      return 1;
    }
    if (in_RDI[9] < 2) {
      fprintf(_stderr,"Found premature byte %08x when searching for a start code!\n",
              (ulong)*(byte *)(in_RDI + 6));
      return 1;
    }
    if (in_RDI[4] <= in_RDI[8]) {
      fprintf(_stderr,"End of bitstream when searching for a start code!\n");
      return 1;
    }
    iVar4 = in_RDI[8];
    in_RDI[8] = iVar4 + 1;
    *(undefined1 *)(in_RDI + 6) = *(undefined1 *)(*(long *)(in_RDI + 2) + (long)iVar4);
    in_RDI[9] = 0;
    in_RSI->dir = (uint)*(byte *)(in_RDI + 6);
  }
  return 0;
}

Assistant:

int vs_start(struct bitstream *str, uint32_t *val) {
	if (str->type == VS_H261 || str->type == VS_H263) {
		int nzbit = (str->type == VS_H261 ? 15 : 16);
		int nsbit = (str->type == VS_H261 ? 4 : 5);
		int bit = 0;
		while (str->zero_bits < nzbit) {
			if (vs_bit(str, &bit)) return 1;
			if (bit != 0) {
				fprintf(stderr, "Found premature 1 bit when searching for a start code!\n");
				return 1;
			}
		}
		while (bit == 0) {
			bit = 1;
			if (vs_bit(str, &bit)) return 1;
		}
		if (vs_u(str, val, nsbit)) return 1;
		return 0;
	} else {
		if (str->bitpos != 7) {
			fprintf (stderr, "Start code attempted at non-bytealigned position\n");
			return 1;
		}
		if (str->dir == VS_ENCODE) {
			ADDARRAY(str->bytes, 0);
			ADDARRAY(str->bytes, 0);
			ADDARRAY(str->bytes, 1);
			ADDARRAY(str->bytes, *val);
		} else {
			str->zero_bytes--;
			do {
				str->zero_bytes++;
				if (str->bytepos >= str->bytesnum) {
					fprintf(stderr, "End of bitstream when searching for a start code!\n");
					return 1;
				}
				str->curbyte = str->bytes[str->bytepos++];
			} while (str->curbyte == 0);
			if (str->curbyte != 1) {
				fprintf(stderr, "Found byte %08x when searching for a start code!\n", str->curbyte);
				return 1;
			}
			if (str->zero_bytes < 2) {
				fprintf(stderr, "Found premature byte %08x when searching for a start code!\n", str->curbyte);
				return 1;
			}
			if (str->bytepos >= str->bytesnum) {
				fprintf(stderr, "End of bitstream when searching for a start code!\n");
				return 1;
			}
			str->curbyte = str->bytes[str->bytepos++];
			str->zero_bytes = 0;
			*val = str->curbyte;
		}
	}
	return 0;
}